

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O1

filepos_t MemSeek(memstream *p,filepos_t VirtualPos,int SeekMode)

{
  bool bVar1;
  long lVar2;
  
  if (SeekMode == 1) {
    lVar2 = 0x130;
  }
  else {
    if (SeekMode != 2) goto LAB_00114c7a;
    lVar2 = 0x138;
  }
  VirtualPos = VirtualPos + *(long *)((p->Base).URL + lVar2 + -0x20) + p->VirtualOffset;
LAB_00114c7a:
  if (VirtualPos < 0) {
    __assert_fail("VirtualPos>=0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/memstream.c"
                  ,0x44,"filepos_t MemSeek(memstream *, filepos_t, int)");
  }
  lVar2 = p->VirtualOffset + p->Size;
  if ((lVar2 < VirtualPos) && (bVar1 = (long)p->Size < VirtualPos, VirtualPos = lVar2, bVar1)) {
    __assert_fail("VirtualPos<=(filepos_t)p->Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/memstream.c"
                  ,0x4a,"filepos_t MemSeek(memstream *, filepos_t, int)");
  }
  p->Pos = VirtualPos - p->VirtualOffset;
  return VirtualPos;
}

Assistant:

static filepos_t MemSeek(memstream* p,filepos_t VirtualPos,int SeekMode)
{
    switch (SeekMode)
    {
    default:
    case SEEK_SET: break;
    case SEEK_CUR: VirtualPos += p->Pos + p->VirtualOffset; break;
    case SEEK_END: VirtualPos += p->Size + p->VirtualOffset; break;
    }

    // TODO: these safety checks should return an error
    if (VirtualPos<0)
    {
        assert(VirtualPos>=0);
        VirtualPos=0;
    }

    if (VirtualPos>(filepos_t)p->Size + p->VirtualOffset)
    {
        assert(VirtualPos<=(filepos_t)p->Size);
        VirtualPos=p->Size + p->VirtualOffset;
    }

    p->Pos = (size_t)(VirtualPos - p->VirtualOffset);
    return VirtualPos;
}